

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

bool __thiscall Kernel::Clause::computable(Clause *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = (*(uint *)&this->field_0x38 & 0xfffff) == 0;
  if (!bVar4) {
    uVar3 = 0;
    do {
      bVar1 = Literal::isAnswerLiteral(this->_literals[uVar3]);
      if ((!bVar1) &&
         (iVar2 = (**(this->_literals[uVar3]->super_Term)._vptr_Term)(), (char)iVar2 == '\0')) {
        return bVar4;
      }
      uVar3 = uVar3 + 1;
      bVar1 = uVar3 < ((uint)*(undefined8 *)&this->field_0x38 & 0xfffff);
      bVar4 = !bVar1;
    } while (bVar1);
  }
  return bVar4;
}

Assistant:

bool Clause::computable() {
  for (unsigned i = 0; i < length(); ++i) {
    if ((*this)[i]->isAnswerLiteral()) {
      continue;
    }
    if (!(*this)[i]->computable()) {
      return false;
    }
  }
  return true;
}